

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

vector<duckdb::MemoryInformation,_true> * __thiscall
duckdb::StandardBufferManager::GetMemoryUsageInfo
          (vector<duckdb::MemoryInformation,_true> *__return_storage_ptr__,
          StandardBufferManager *this)

{
  pointer *ppMVar1;
  long *plVar2;
  atomic<long> *paVar3;
  long lVar4;
  BufferPool *pBVar5;
  iterator __position;
  int64_t cached;
  long lVar6;
  idx_t k;
  long lVar7;
  long lVar8;
  long lVar9;
  MemoryInformation info;
  MemoryInformation local_48;
  
  (__return_storage_ptr__->
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = 0;
  lVar7 = 0;
  do {
    local_48.tag = (MemoryTag)lVar7;
    pBVar5 = this->buffer_pool;
    lVar8 = 0xf8;
    lVar6 = 0;
    do {
      LOCK();
      plVar2 = (long *)((long)(pBVar5->eviction_queue_sizes)._M_elems + lVar8 + lVar9 + -8);
      lVar4 = *plVar2;
      *plVar2 = 0;
      UNLOCK();
      lVar6 = lVar6 + lVar4;
      lVar8 = lVar8 + 0x78;
    } while (lVar8 != 0x1ef8);
    LOCK();
    paVar3 = (pBVar5->memory_usage).memory_usage._M_elems + lVar7;
    lVar8 = (paVar3->super___atomic_base<long>)._M_i;
    (paVar3->super___atomic_base<long>)._M_i = (paVar3->super___atomic_base<long>)._M_i + lVar6;
    UNLOCK();
    local_48.size = lVar8 + lVar6;
    if ((long)local_48.size < 1) {
      local_48.size = 0;
    }
    local_48.evicted_data =
         this->evicted_data_per_tag[lVar7].super___atomic_base<unsigned_long>._M_i;
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
         super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>).
        super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::MemoryInformation,std::allocator<duckdb::MemoryInformation>>::
      _M_realloc_insert<duckdb::MemoryInformation_const&>
                ((vector<duckdb::MemoryInformation,std::allocator<duckdb::MemoryInformation>> *)
                 __return_storage_ptr__,__position,&local_48);
    }
    else {
      (__position._M_current)->evicted_data = local_48.evicted_data;
      *(ulong *)__position._M_current = CONCAT71(local_48._1_7_,local_48.tag);
      (__position._M_current)->size = local_48.size;
      ppMVar1 = &(__return_storage_ptr__->
                 super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>
                 ).
                 super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + 8;
  } while (lVar7 != 0xe);
  return __return_storage_ptr__;
}

Assistant:

vector<MemoryInformation> StandardBufferManager::GetMemoryUsageInfo() const {
	vector<MemoryInformation> result;
	for (idx_t k = 0; k < MEMORY_TAG_COUNT; k++) {
		MemoryInformation info;
		info.tag = MemoryTag(k);
		info.size = buffer_pool.memory_usage.GetUsedMemory(MemoryTag(k), BufferPool::MemoryUsageCaches::FLUSH);
		info.evicted_data = evicted_data_per_tag[k].load();
		result.push_back(info);
	}
	return result;
}